

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O0

float __thiscall NormalDistribution::getRandomNumber(NormalDistribution *this)

{
  float fVar1;
  bool bVar2;
  result_type_conflict1 rVar3;
  double dVar4;
  bool accepted;
  float u3;
  float u2;
  float u1;
  NormalDistribution *this_local;
  
  bVar2 = false;
  while (!bVar2) {
    rVar3 = std::uniform_real_distribution<double>::operator()
                      (&(this->super_Distribution).distrib,&(this->super_Distribution).gen);
    u3 = (float)rVar3;
    rVar3 = std::uniform_real_distribution<double>::operator()
                      (&(this->super_Distribution).distrib,&(this->super_Distribution).gen);
    dVar4 = log((double)u3);
    dVar4 = pow(-dVar4 - 1.0,2.0);
    dVar4 = exp(dVar4 * -0.5);
    if ((double)(float)rVar3 <= dVar4) {
      bVar2 = true;
    }
  }
  rVar3 = std::uniform_real_distribution<double>::operator()
                    (&(this->super_Distribution).distrib,&(this->super_Distribution).gen);
  if (0.5 <= (float)rVar3) {
    fVar1 = this->sigma;
    dVar4 = log((double)u3);
    dVar4 = (double)-fVar1 * dVar4 + (double)this->mu;
  }
  else {
    fVar1 = this->sigma;
    dVar4 = log((double)u3);
    dVar4 = (double)fVar1 * dVar4 + (double)this->mu;
  }
  this_local._4_4_ = (float)dVar4;
  return this_local._4_4_;
}

Assistant:

float NormalDistribution::getRandomNumber() {
	float u1;
	float u2;
	float u3;
	bool accepted = false;

	while(!accepted){
		u1 = this->distrib(gen);
		u2 = this->distrib(gen);
		if (u2 <= exp(-0.5*pow(-log(u1)-1,2))){
			accepted = true;
		}
	}

	u3 = this->distrib(gen);
	if (u3 < 0.5) return sigma*log(u1)+mu;
	else return -sigma*log(u1)+mu;
}